

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall coda_url::assign_anchor(coda_url *this,char *beg,uint32_t flags)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  coda_url *__src;
  coda_url *pcVar5;
  undefined4 in_EDX;
  coda_url *in_RSI;
  long *in_RDI;
  char *end;
  char *p;
  coda_url *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  coda_url *this_00;
  
  pcVar3 = coda_strnchr((char *)*in_RDI,'#',(ulong)*(uint *)(in_RDI + 1));
  if (pcVar3 != (char *)0x0) {
    *(int *)(in_RDI + 1) = (int)pcVar3 - (int)*in_RDI;
  }
  local_28 = (coda_url *)
             coda_strnchr((char *)in_RSI,'/',(*in_RDI + (ulong)*(uint *)(in_RDI + 1)) - (long)in_RSI
                         );
  pcVar5 = in_RSI;
  if (local_28 == (coda_url *)0x0) {
    local_28 = (coda_url *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1));
  }
  for (; in_RSI < local_28; in_RSI = (coda_url *)((long)&in_RSI->val_str + 1)) {
    iVar2 = tolower((int)*(char *)&in_RSI->val_str);
    *(char *)&in_RSI->val_str = (char)iVar2;
    if (((((*(char *)&in_RSI->val_str < 'a') || ('z' < *(char *)&in_RSI->val_str)) &&
         ((*(char *)&in_RSI->val_str < 'A' || ('Z' < *(char *)&in_RSI->val_str)))) &&
        ((((*(char *)&in_RSI->val_str < '0' || ('9' < *(char *)&in_RSI->val_str)) &&
          (*(char *)&in_RSI->val_str != '.')) &&
         ((*(char *)&in_RSI->val_str != ':' && (*(char *)&in_RSI->val_str != '-')))))) &&
       (*(char *)&in_RSI->val_str != '_')) break;
  }
  if (local_28 == in_RSI) {
    if ((coda_url *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)) == local_28) {
      local_28 = (coda_url *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1));
      uVar1 = *(uint *)(in_RDI + 1);
      *(uint *)(in_RDI + 1) = uVar1 + 1;
      *(undefined1 *)(*in_RDI + (ulong)uVar1) = 0x2f;
    }
  }
  else {
    memmove((char *)((long)&in_RSI->val_str + 1),in_RSI,
            (*in_RDI + (ulong)*(uint *)(in_RDI + 1)) - (long)in_RSI);
    *(char *)&in_RSI->val_str = '/';
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
    local_28 = in_RSI;
  }
  this_00 = pcVar5;
  sVar4 = coda_strnspn((char *)pcVar5,".",(long)local_28 - (long)pcVar5);
  __src = (coda_url *)((long)&pcVar5->val_str + sVar4);
  if (pcVar5 != __src) {
    memmove(this_00,__src,(*in_RDI + (ulong)*(uint *)(in_RDI + 1)) - (long)__src);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] - ((int)__src - (int)this_00);
    local_28 = (coda_url *)((long)local_28 - ((long)__src - (long)this_00));
  }
  sVar4 = coda_revnspn((char *)this_00,".",(long)local_28 - (long)this_00);
  pcVar5 = (coda_url *)((long)local_28 - sVar4);
  if (local_28 != pcVar5) {
    memmove((char *)((long)&pcVar5->val_str + 1),local_28,
            (*in_RDI + (ulong)*(uint *)(in_RDI + 1)) - (long)local_28);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] - ((int)local_28 - ((int)pcVar5 + 1));
    local_28 = (coda_url *)((long)&pcVar5->val_str + 1);
  }
  pcVar3 = coda_revnchr((char *)this_00,'.',(size_t)((long)local_28 + (-1 - (long)this_00)));
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &this_00[-1].field_0x1f;
  }
  pcVar3 = coda_revnchr((char *)this_00,'.',(size_t)(pcVar3 + (-1 - (long)this_00)));
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &this_00[-1].field_0x1f;
  }
  in_RDI[2] = (long)(pcVar3 + 1);
  *(int *)(in_RDI + 3) = (int)local_28 - ((int)pcVar3 + 1);
  iVar2 = assign_refers(this_00,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        (uint32_t)((ulong)pcVar3 >> 0x20));
  return iVar2;
}

Assistant:

int coda_url::assign_anchor(char *beg, uint32_t flags)
{
	char *p;
	char *end;

	if (NULL != (end = coda_strnchr(val_str, '#', val_len)))
	{
		val_len = end - val_str;
	}

	end = coda_strnchr(beg, '/', val_str + val_len - beg);
	if (NULL == end) end = val_str + val_len;

	for (p = beg; p < end; ++p)
	{
		*p = tolower(*p);

		if (!DOMAIN_SYMBOL(*p))
		{
			break;
		}
	}

	if (end == p)
	{
		if (val_str + val_len == end)
		{
			end = val_str + val_len;
			val_str[val_len++] = '/';
		}
	}
	else
	{
		memmove(p + 1, p, val_str + val_len - p);
		end = p; p[0] = '/'; val_len++;
	}

	if (beg != (p = beg + coda_strnspn(beg, ".", end - beg)))
	{
		memmove(beg, p, val_str + val_len - p);
		val_len -= p - beg;
			end -= p - beg;
	}

	if (end != (p = end - coda_revnspn(beg, ".", end - beg)))
	{
		memmove(p + 1, end, val_str + val_len - end);
		val_len -= end - (p + 1);
			end -= end - (p + 1);
	}

	p = end;

	if (NULL == (p = coda_revnchr(beg, '.', (p - 1) - beg))) p = beg - 1;
	if (NULL == (p = coda_revnchr(beg, '.', (p - 1) - beg))) p = beg - 1;

	dom_str = p + 1;
	dom_len = end - (p + 1);

	return assign_refers(end, flags);
}